

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes.c
# Opt level: O2

int nes_pack_8x8_tile(uchar *buffer,void *data,int line_offset,int format)

{
  long lVar1;
  int iVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  char *stptr;
  int iVar6;
  byte bVar7;
  byte bVar8;
  uint uVar9;
  
  if (pass == 1) {
    buffer[0] = '\0';
    buffer[1] = '\0';
    buffer[2] = '\0';
    buffer[3] = '\0';
    buffer[4] = '\0';
    buffer[5] = '\0';
    buffer[6] = '\0';
    buffer[7] = '\0';
    buffer[8] = '\0';
    buffer[9] = '\0';
    buffer[10] = '\0';
    buffer[0xb] = '\0';
    buffer[0xc] = '\0';
    buffer[0xd] = '\0';
    buffer[0xe] = '\0';
    buffer[0xf] = '\0';
    if (format == 1) {
      for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
        bVar8 = buffer[lVar1];
        bVar7 = buffer[lVar1 + 8];
        for (uVar9 = 0; uVar9 != 8; uVar9 = uVar9 + 1) {
          bVar3 = *(byte *)((long)data + ((ulong)uVar9 ^ 7));
          bVar5 = (byte)(1 << ((byte)uVar9 & 0x1f));
          bVar4 = bVar3 & 1;
          if ((bVar3 & 1) != 0) {
            bVar4 = bVar5;
          }
          bVar8 = bVar8 | bVar4;
          bVar4 = bVar3 & 2;
          if ((bVar3 & 2) != 0) {
            bVar4 = bVar5;
          }
          buffer[lVar1] = bVar8;
          bVar7 = bVar7 | bVar4;
          buffer[lVar1 + 8] = bVar7;
        }
        data = (void *)((long)data + (long)line_offset);
      }
    }
    else {
      if (format == 2) {
        iVar6 = 0;
        for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
          uVar9 = *(uint *)((long)data + lVar1 * 4);
          bVar8 = buffer[lVar1];
          bVar7 = buffer[lVar1 + 8];
          for (iVar2 = 0; iVar2 != 8; iVar2 = iVar2 + 1) {
            iVar6 = (iVar6 + 1) - (uint)((uVar9 & 0xc) == 0);
            bVar4 = (byte)(1 << ((byte)iVar2 & 0x1f));
            bVar3 = (byte)(uVar9 & 1);
            if ((uVar9 & 1) != 0) {
              bVar3 = bVar4;
            }
            bVar8 = bVar8 | bVar3;
            bVar3 = (byte)(uVar9 & 2);
            if ((uVar9 & 2) != 0) {
              bVar3 = bVar4;
            }
            bVar7 = bVar7 | bVar3;
            uVar9 = uVar9 >> 4;
          }
          buffer[lVar1] = bVar8;
          buffer[lVar1 + 8] = bVar7;
        }
        if (iVar6 == 0) {
          return 0x10;
        }
        stptr = "Incorrect pixel color index!";
      }
      else {
        stptr = "Internal error: unsupported format passed to \'pack_8x8_tile\'!";
      }
      error(stptr);
    }
  }
  return 0x10;
}

Assistant:

int
nes_pack_8x8_tile(unsigned char *buffer, void *data, int line_offset, int format)
{
	int i, j;
	int cnt, err;
	unsigned int   pixel;
	unsigned char *ptr;
	unsigned int  *packed;

	/* pack the tile only in the last pass */
	if (pass != LAST_PASS)
		return (16);

	/* clear buffer */
	memset(buffer, 0, 16);

	/* encode the tile */
	switch (format) {
	case CHUNKY_TILE:
		/* 8-bit chunky format */
		cnt = 0;
		ptr = data;

		for (i = 0; i < 8; i++) {
			for (j = 0; j < 8; j++) {
				pixel = ptr[j ^ 0x07];
				buffer[cnt]   |= (pixel & 0x01) ? (1 << j) : 0;
				buffer[cnt+8] |= (pixel & 0x02) ? (1 << j) : 0;
			}				
			ptr += line_offset;
			cnt += 1;
		}
		break;

	case PACKED_TILE:
		/* 4-bit packed format */
		cnt = 0;
		err = 0;
		packed = data;
	
		for (i = 0; i < 8; i++) {
			pixel = packed[i];
	
			for (j = 0; j < 8; j++) {
				/* check for errors */
				if (pixel & 0x0C)
					err++;

				/* convert the tile */
				buffer[cnt]   |= (pixel & 0x01) ? (1 << j) : 0;
				buffer[cnt+8] |= (pixel & 0x02) ? (1 << j) : 0;
				pixel >>= 4;
			}
			cnt += 1;
		}

		/* error message */
		if (err)
			error("Incorrect pixel color index!");
		break;

	default:
		/* other formats not supported */
		error("Internal error: unsupported format passed to 'pack_8x8_tile'!");
		break;
	}

	/* ok */
	return (16);
}